

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

void tmCalcFreq(void)

{
  tm_ticks_t tVar1;
  tm_ticks_t tVar2;
  tm_ticks_t tVar3;
  tm_ticks_t tVar4;
  tm_ticks_t overhead;
  tm_ticks_t start;
  
  tVar1 = tmTicks();
  tVar2 = tmTicks();
  tVar3 = tmTicks();
  mtSleep((u32)(tVar2 - tVar1 >> 0x20));
  tVar4 = tmTicks();
  _freq = ((tVar4 - tVar3) - (tVar2 - tVar1)) * 10;
  return;
}

Assistant:

static void tmCalcFreq()
{
	tm_ticks_t start;
	tm_ticks_t overhead;
	start = tmTicks();
	overhead = tmTicks() - start;
	start = tmTicks();
	mtSleep(100);
	_freq = tmTicks();
	_freq = (_freq - start - overhead) * 10;
}